

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defuse.h
# Opt level: O2

int __thiscall mocker::DefUseChain::init(DefUseChain *this,EVP_PKEY_CTX *ctx)

{
  pointer psVar1;
  EVP_PKEY_CTX *in_RAX;
  mapped_type *this_00;
  EVP_PKEY_CTX *extraout_RAX;
  vector<mocker::DefUseChain::Use,std::allocator<mocker::DefUseChain::Use>> *this_01;
  EVP_PKEY_CTX *pEVar2;
  EVP_PKEY_CTX *pEVar3;
  pointer psVar4;
  EVP_PKEY_CTX *pEVar5;
  shared_ptr<mocker::ir::Reg> dest;
  shared_ptr<mocker::ir::Reg> reg;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_78;
  EVP_PKEY_CTX *local_60;
  EVP_PKEY_CTX *local_58;
  EVP_PKEY_CTX *local_50;
  unsigned_long local_48;
  shared_ptr<mocker::ir::Addr> local_40;
  
  pEVar2 = ctx + 0x38;
  pEVar3 = pEVar2;
  while (pEVar3 = *(EVP_PKEY_CTX **)pEVar3, pEVar3 != pEVar2) {
    pEVar5 = pEVar3 + 0x18;
    while (pEVar5 = *(EVP_PKEY_CTX **)pEVar5, pEVar5 != pEVar3 + 0x18) {
      ir::getDest((shared_ptr<mocker::ir::IRInst> *)&local_78);
      if (local_78.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        this_00 = std::__detail::
                  _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this,(key_type *)&local_78);
        std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>::operator=
                  (this_00,(initializer_list<mocker::DefUseChain::Use>)ZEXT816(0));
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_78.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      in_RAX = extraout_RAX;
    }
  }
  local_60 = pEVar2;
  while (pEVar2 = *(EVP_PKEY_CTX **)pEVar2, pEVar2 != local_60) {
    local_50 = pEVar2 + 0x18;
    local_58 = local_50;
    while (in_RAX = *(EVP_PKEY_CTX **)local_50, in_RAX != local_58) {
      local_50 = in_RAX;
      ir::getOperandsUsed(&local_78,(shared_ptr<mocker::ir::IRInst> *)(in_RAX + 0x10));
      psVar1 = local_78.
               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar4 = local_78.
                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1
          ) {
        ir::dycLocalReg(&local_40);
        if (local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          this_01 = (vector<mocker::DefUseChain::Use,std::allocator<mocker::DefUseChain::Use>> *)
                    std::__detail::
                    _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)this,(key_type *)&local_40);
          local_48 = *(unsigned_long *)(pEVar2 + 0x10);
          std::vector<mocker::DefUseChain::Use,std::allocator<mocker::DefUseChain::Use>>::
          emplace_back<unsigned_long,std::shared_ptr<mocker::ir::IRInst>const&>
                    (this_01,&local_48,(shared_ptr<mocker::ir::IRInst> *)(in_RAX + 0x10));
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::
      vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
      ::~vector(&local_78);
    }
  }
  return (int)in_RAX;
}

Assistant:

void init(const ir::FunctionModule &func) {
    for (auto &bb : func.getBBs()) {
      for (auto &inst : bb.getInsts()) {
        if (auto dest = ir::getDest(inst))
          chain[dest] = {};
      }
    }

    for (auto &bb : func.getBBs()) {
      for (auto &inst : bb.getInsts()) {
        auto operands = ir::getOperandsUsed(inst);
        for (auto &operand : operands) {
          auto reg = ir::dycLocalReg(operand);
          if (!reg)
            continue;
          chain[reg].emplace_back(bb.getLabelID(), inst);
        }
      }
    }
  }